

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cpu-flags.c
# Opt level: O0

void cpu_flags_get(void)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  uint level_ext;
  uint level;
  uint edx;
  uint ecx;
  uint ebx;
  
  cpu_flags = 0;
  uVar1 = get_cpuid(0,0,&edx,&level,&level_ext);
  uVar2 = get_cpuid(1,0,&edx,&level,&level_ext);
  if ((uVar1 != 0) && (uVar3 = get_cpuid(0,1,&edx,&level,&level_ext), uVar3 != 0)) {
    if ((level_ext & 0x4000000) != 0) {
      cpu_flags = cpu_flags | 1;
    }
    if ((level & 0x200) != 0) {
      cpu_flags = cpu_flags | 2;
    }
  }
  if ((6 < uVar1) && (uVar1 = get_cpuid_count(0,7,0,&edx,&level,&level_ext), uVar1 != 0)) {
    if ((edx & 0x20) != 0) {
      cpu_flags = cpu_flags | 8;
    }
    if ((edx & 0x10000) != 0) {
      cpu_flags = cpu_flags | 0x10;
    }
  }
  if (((uVar2 != 0) && (uVar1 = get_cpuid(1,1,&edx,&level,&level_ext), uVar1 != 0)) &&
     ((level & 0x800) != 0)) {
    cpu_flags = cpu_flags | 4;
  }
  return;
}

Assistant:

void cpu_flags_get(void)
{
    unsigned int ebx, ecx, edx;
    unsigned int level, level_ext;

    cpu_flags = 0;
    level     = get_cpuid(0, 0, &ebx, &ecx, &edx);
    level_ext = get_cpuid(1, 0, &ebx, &ecx, &edx);

    if (level >= 1 && get_cpuid(0, 1, &ebx, &ecx, &edx)) {
        if (edx & (1 << 26)) {
            cpu_flags |= X86_64_FEATURE_SSE2;
        }
        if (ecx & (1 << 9)) {
            cpu_flags |= X86_64_FEATURE_SSSE3;
        }
    }
    if (level >= 7 && get_cpuid_count(0, 7, 0, &ebx, &ecx, &edx)) {
        if (ebx & (1 << 5)) {
            cpu_flags |= X86_64_FEATURE_AVX2;
        }
        if (ebx & (1 << 16)) {
            cpu_flags |= X86_64_FEATURE_AVX512F;
        }
    }
    if (level_ext >= 1 && get_cpuid(1, 1, &ebx, &ecx, &edx)) {
        if (ecx & (1 << 11)) {
            cpu_flags |= X86_64_FEATURE_XOP;
        }
    }
    /* FIXME: check also OS support! */
}